

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_repeat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion p_00;
  int iVar1;
  uint uVar2;
  JSContext *in_RDI;
  JSValue JVar3;
  int len;
  int n;
  int64_t val;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue str;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  JSContext *in_stack_ffffffffffffff40;
  JSContext *pJVar4;
  JSValue in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff58 [16];
  int local_84;
  long local_80;
  JSValueUnion local_48;
  list_head *local_40;
  JSContext *local_28;
  JSValueUnion local_10;
  int64_t local_8;
  
  pJVar4 = (JSContext *)&stack0xffffffffffffff98;
  local_28 = in_RDI;
  JVar3 = JS_ToStringCheckObject(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  local_48 = JVar3.u;
  local_40 = (list_head *)JVar3.tag;
  iVar1 = JS_IsException(JVar3);
  if ((iVar1 == 0) &&
     (iVar1 = JS_ToInt64Sat(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_,JVar3),
     p_00 = local_48, iVar1 == 0)) {
    if ((local_80 < 0) || (0x7fffffff < local_80)) {
      JS_ThrowRangeError(local_28,"invalid repeat count");
    }
    else {
      local_84 = (int)local_80;
      uVar2 = (uint)*(ulong *)((long)local_48.ptr + 4) & 0x7fffffff;
      if (((*(ulong *)((long)local_48.ptr + 4) & 0x7fffffff) == 0) || (local_84 == 1)) {
        local_8 = (int64_t)local_40;
        local_10.ptr = local_48.ptr;
        return _local_10;
      }
      if (local_80 * (int)uVar2 < 0x40000000) {
        iVar1 = string_buffer_init2((JSContext *)in_stack_ffffffffffffff48.u.ptr,
                                    (StringBuffer *)in_stack_ffffffffffffff40,
                                    in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        if (iVar1 == 0) {
          if (uVar2 == 1) {
            string_get((JSString *)p_00.ptr,0);
            string_buffer_fill((StringBuffer *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0,
                               0x1ba888);
            in_stack_ffffffffffffff40 = pJVar4;
          }
          else {
            while (0 < local_84) {
              string_buffer_concat
                        ((StringBuffer *)in_stack_ffffffffffffff48.u.ptr,
                         (JSString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
              local_84 = local_84 + -1;
            }
          }
          JS_FreeValue(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
          JVar3 = string_buffer_end((StringBuffer *)in_stack_ffffffffffffff40);
          return JVar3;
        }
      }
      else {
        in_stack_ffffffffffffff48 = JS_ThrowInternalError(local_28,"string too long");
      }
    }
  }
  JS_FreeValue(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  local_10.ptr = (void *)(stack0xfffffffffffffff4 << 0x20);
  local_8 = 6;
  return _local_10;
}

Assistant:

static JSValue js_string_repeat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int64_t val;
    int n, len;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail;
    if (JS_ToInt64Sat(ctx, &val, argv[0]))
        goto fail;
    if (val < 0 || val > 2147483647) {
        JS_ThrowRangeError(ctx, "invalid repeat count");
        goto fail;
    }
    n = val;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len == 0 || n == 1)
        return str;
    if (val * len > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail;
    }
    if (string_buffer_init2(ctx, b, n * len, p->is_wide_char))
        goto fail;
    if (len == 1) {
        string_buffer_fill(b, string_get(p, 0), n);
    } else {
        while (n-- > 0) {
            string_buffer_concat(b, p, 0, len);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}